

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wf.h
# Opt level: O1

TokenTerminalDistance * __thiscall
trieste::wf::Wellformed::compute_minimum_distance_to_terminal
          (TokenTerminalDistance *__return_storage_ptr__,Wellformed *this,size_t max_distance)

{
  _Rb_tree_header *p_Var1;
  size_t sVar2;
  mapped_type *pmVar3;
  _Base_ptr p_Var4;
  undefined8 local_68;
  undefined8 uStack_60;
  undefined8 local_58;
  undefined8 *puStack_50;
  undefined8 *local_48;
  undefined8 uStack_40;
  
  p_Var1 = &(__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var4 = (this->shapes)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  p_Var1 = &(this->shapes)._M_t._M_impl.super__Rb_tree_header;
  if ((_Rb_tree_header *)p_Var4 != p_Var1) {
    do {
      local_58 = 0;
      local_68 = 0;
      uStack_60 = 0;
      puStack_50 = &uStack_60;
      uStack_40 = 0;
      local_48 = puStack_50;
      sVar2 = min_dist_to_terminal
                        (this,__return_storage_ptr__,
                         (set<trieste::Token,_std::less<trieste::Token>,_std::allocator<trieste::Token>_>
                          *)&local_68,max_distance,(Token *)(p_Var4 + 1));
      pmVar3 = CLI::std::
               map<trieste::Token,_unsigned_long,_std::less<trieste::Token>,_std::allocator<std::pair<const_trieste::Token,_unsigned_long>_>_>
               ::operator[]((map<trieste::Token,_unsigned_long,_std::less<trieste::Token>,_std::allocator<std::pair<const_trieste::Token,_unsigned_long>_>_>
                             *)__return_storage_ptr__,(key_type *)(p_Var4 + 1));
      *pmVar3 = sVar2;
      std::
      _Rb_tree<trieste::Token,_trieste::Token,_std::_Identity<trieste::Token>,_std::less<trieste::Token>,_std::allocator<trieste::Token>_>
      ::~_Rb_tree((_Rb_tree<trieste::Token,_trieste::Token,_std::_Identity<trieste::Token>,_std::less<trieste::Token>,_std::allocator<trieste::Token>_>
                   *)&local_68);
      p_Var4 = (_Base_ptr)std::_Rb_tree_increment(p_Var4);
    } while ((_Rb_tree_header *)p_Var4 != p_Var1);
  }
  return __return_storage_ptr__;
}

Assistant:

TokenTerminalDistance
      compute_minimum_distance_to_terminal(std::size_t max_distance) const
      {
        TokenTerminalDistance distance;

        for (auto& [token, _] : shapes)
        {
          distance[token] =
            min_dist_to_terminal(distance, {}, max_distance, token);
        }

        return distance;
      }